

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cpp
# Opt level: O3

bool __thiscall Gluco::SimpSolver::merge(SimpSolver *this,Clause *_ps,Clause *_qs,Var v,int *size)

{
  uint uVar1;
  uint uVar2;
  Clause *pCVar3;
  int iVar4;
  long lVar5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  
  this->merges = this->merges + 1;
  iVar6 = (int)((ulong)*(undefined8 *)&_ps->header >> 0x20);
  iVar4 = (int)((ulong)*(undefined8 *)&_qs->header >> 0x20);
  pCVar3 = _qs;
  if (iVar6 < iVar4) {
    pCVar3 = _ps;
    _ps = _qs;
    iVar6 = iVar4;
  }
  iVar6 = iVar6 + -1;
  *size = iVar6;
  lVar5 = *(long *)&pCVar3->header;
  if (0 < (int)((ulong)lVar5 >> 0x20)) {
    lVar7 = 0;
    do {
      uVar1 = *(uint *)(&pCVar3[1].header.field_0x0 + lVar7 * 4);
      iVar4 = (int)uVar1 >> 1;
      if (iVar4 != v) {
        if (0 < (int)(*(ulong *)&_ps->header >> 0x20)) {
          uVar8 = 0;
          do {
            uVar2 = *(uint *)(&_ps[1].header.field_0x0 + uVar8 * 4);
            if ((int)uVar2 >> 1 == iVar4) {
              if ((uVar2 ^ uVar1) == 1) {
                return false;
              }
              goto LAB_005c7c26;
            }
            uVar8 = uVar8 + 1;
          } while (*(ulong *)&_ps->header >> 0x20 != uVar8);
        }
        iVar6 = iVar6 + 1;
        *size = iVar6;
        lVar5 = *(long *)&pCVar3->header;
      }
LAB_005c7c26:
      lVar7 = lVar7 + 1;
    } while (lVar7 < lVar5 >> 0x20);
  }
  return true;
}

Assistant:

bool SimpSolver::merge(const Clause& _ps, const Clause& _qs, Var v, int& size)
{
    merges++;

    bool  ps_smallest = _ps.size() < _qs.size();
    const Clause& ps  =  ps_smallest ? _qs : _ps;
    const Clause& qs  =  ps_smallest ? _ps : _qs;
    const Lit*  __ps  = (const Lit*)ps;
    const Lit*  __qs  = (const Lit*)qs;

    size = ps.size()-1;

    for (int i = 0; i < qs.size(); i++){
        if (var(__qs[i]) != v){
            for (int j = 0; j < ps.size(); j++)
                if (var(__ps[j]) == var(__qs[i])) {
                    if (__ps[j] == ~__qs[i])
                        return false;
                    else
                        goto next;
                }
            size++;
        }
        next:;
    }

    return true;
}